

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGuiIO::AddInputCharacter(ImGuiIO *this,uint c)

{
  int *piVar1;
  ImGuiInputEvent *pIVar2;
  ImGuiContext *pIVar3;
  int iVar4;
  ImGuiInputEvent *__dest;
  int iVar5;
  int iVar6;
  ImGuiContext *ctx;
  
  pIVar3 = GImGui;
  if (c != 0) {
    iVar4 = (GImGui->InputEventsQueue).Size;
    if (iVar4 == (GImGui->InputEventsQueue).Capacity) {
      if (iVar4 == 0) {
        iVar5 = 8;
      }
      else {
        iVar5 = iVar4 / 2 + iVar4;
      }
      iVar6 = iVar4 + 1;
      if (iVar4 + 1 < iVar5) {
        iVar6 = iVar5;
      }
      piVar1 = &(GImGui->IO).MetricsActiveAllocations;
      *piVar1 = *piVar1 + 1;
      __dest = (ImGuiInputEvent *)(*GImAllocatorAllocFunc)((long)iVar6 * 0x18,GImAllocatorUserData);
      pIVar2 = (pIVar3->InputEventsQueue).Data;
      if (pIVar2 != (ImGuiInputEvent *)0x0) {
        memcpy(__dest,pIVar2,(long)(pIVar3->InputEventsQueue).Size * 0x18);
        pIVar2 = (pIVar3->InputEventsQueue).Data;
        if ((pIVar2 != (ImGuiInputEvent *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar2,GImAllocatorUserData);
      }
      (pIVar3->InputEventsQueue).Data = __dest;
      (pIVar3->InputEventsQueue).Capacity = iVar6;
      iVar4 = (pIVar3->InputEventsQueue).Size;
    }
    else {
      __dest = (GImGui->InputEventsQueue).Data;
    }
    __dest[iVar4].Type = ImGuiInputEventType_Text;
    __dest[iVar4].Source = ImGuiInputSource_Keyboard;
    __dest[iVar4].field_2.MouseButton.Button = c;
    *(undefined8 *)((long)&__dest[iVar4].field_2 + 4) = 0;
    *(undefined4 *)&__dest[iVar4].AddedByTestEngine = 0;
    (pIVar3->InputEventsQueue).Size = (pIVar3->InputEventsQueue).Size + 1;
  }
  return;
}

Assistant:

void ImGuiIO::AddInputCharacter(unsigned int c)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(&g.IO == this && "Can only add events to current context.");
    if (c == 0)
        return;

    ImGuiInputEvent e;
    e.Type = ImGuiInputEventType_Text;
    e.Source = ImGuiInputSource_Keyboard;
    e.Text.Char = c;
    g.InputEventsQueue.push_back(e);
}